

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  int iVar4;
  ImGuiWindowSettings *pIVar5;
  char *pcVar6;
  int i;
  ulong uVar7;
  
  for (uVar7 = 0; uVar7 != (uint)(ctx->Windows).Size; uVar7 = uVar7 + 1) {
    pIVar2 = (ctx->Windows).Data[uVar7];
    if ((pIVar2->Flags & 0x100) == 0) {
      if ((long)pIVar2->SettingsOffset == -1) {
        pIVar5 = ImGui::FindWindowSettings(pIVar2->ID);
      }
      else {
        pIVar5 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + pIVar2->SettingsOffset);
      }
      if (pIVar5 == (ImGuiWindowSettings *)0x0) {
        pIVar5 = ImGui::CreateNewWindowSettings(pIVar2->Name);
        pIVar2->SettingsOffset = (int)pIVar5 - *(int *)&(ctx->SettingsWindows).Buf.Data;
      }
      pIVar5->Pos = (ImVec2ih)((int)(pIVar2->Pos).x & 0xffffU | (int)(pIVar2->Pos).y << 0x10);
      pIVar5->Size = (ImVec2ih)
                     ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
      pIVar5->Collapsed = pIVar2->Collapsed;
    }
  }
  iVar1 = (buf->Buf).Size;
  iVar4 = iVar1 + -1;
  if (iVar1 == 0) {
    iVar4 = 0;
  }
  ImVector<char>::reserve(&buf->Buf,(ctx->SettingsWindows).Buf.Size * 6 + iVar4);
  pcVar3 = (ctx->SettingsWindows).Buf.Data;
  pcVar6 = pcVar3 + 4;
  if (pcVar3 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  while (pcVar6 != (char *)0x0) {
    ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pcVar6 + 0x10);
    ImGuiTextBuffer::appendf
              (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar6 + 4),
               (ulong)(uint)(int)*(short *)(pcVar6 + 6));
    ImGuiTextBuffer::appendf
              (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar6 + 8),
               (ulong)(uint)(int)*(short *)(pcVar6 + 10));
    ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)(byte)pcVar6[0xc]);
    ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
    pcVar6 = pcVar6 + *(int *)(pcVar6 + -4);
    if (pcVar6 == (ctx->SettingsWindows).Buf.Data + (long)(ctx->SettingsWindows).Buf.Size + 4) {
      pcVar6 = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}